

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.h
# Opt level: O2

void __thiscall clean_up_fixture::clean_up_fixture(clean_up_fixture *this)

{
  path pStack_68;
  path local_48;
  path local_28;
  
  boost::filesystem::temp_directory_path();
  boost::filesystem::path::path(&pStack_68,"%%%%-%%%%-%%%%-%%%%");
  boost::filesystem::unique_path(&local_48,&pStack_68);
  boost::filesystem::operator/(&this->m_path,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&pStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

clean_up_fixture()
        : m_path(fs::temp_directory_path() / fs::unique_path()) {}